

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall
Fl_Multi_Browser::Fl_Multi_Browser(Fl_Multi_Browser *this,int X,int Y,int W,int H,char *L)

{
  Fl_Browser::Fl_Browser(&this->super_Fl_Browser,X,Y,W,H,L);
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Browser_002768b8;
  (this->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.type_ = '\x03';
  return;
}

Assistant:

Fl_Multi_Browser::Fl_Multi_Browser(int X,int Y,int W,int H,const char *L)
: Fl_Browser(X,Y,W,H,L) 
{
  type(FL_MULTI_BROWSER);
}